

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

size_t parseBackslash(StringRef Src,size_t I,SmallString<128U> *Token)

{
  SmallString<128U> *this;
  char cVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  char local_49;
  SmallString<128U> *local_48;
  StringRef Src_local;
  
  Src_local.Length = Src.Length;
  Src_local.Data = Src.Data;
  uVar3 = (int)Src.Length - (int)I;
  sVar4 = Src_local.Length - 1;
  uVar2 = 0;
  local_48 = Token;
  do {
    sVar5 = I;
    if (sVar4 == sVar5) goto LAB_00157456;
    I = sVar5 + 1;
    cVar1 = llvm::StringRef::operator[](&Src_local,I);
    uVar2 = uVar2 - 1;
  } while (cVar1 == '\\');
  cVar1 = llvm::StringRef::operator[](&Src_local,I);
  this = local_48;
  uVar3 = -uVar2;
  if (cVar1 == '\"') {
    llvm::SmallString<128U>::append(local_48,(ulong)(uVar3 >> 1),'\\');
    if ((~uVar2 & 1) == 0) {
      local_49 = '\"';
      llvm::SmallVectorTemplateBase<char,_true>::push_back
                ((SmallVectorTemplateBase<char,_true> *)this,&local_49);
      sVar5 = I;
    }
  }
  else {
LAB_00157456:
    llvm::SmallString<128U>::append(local_48,(ulong)uVar3,'\\');
  }
  return sVar5;
}

Assistant:

static size_t parseBackslash(StringRef Src, size_t I, SmallString<128> &Token) {
  size_t E = Src.size();
  int BackslashCount = 0;
  // Skip the backslashes.
  do {
    ++I;
    ++BackslashCount;
  } while (I != E && Src[I] == '\\');

  bool FollowedByDoubleQuote = (I != E && Src[I] == '"');
  if (FollowedByDoubleQuote) {
    Token.append(BackslashCount / 2, '\\');
    if (BackslashCount % 2 == 0)
      return I - 1;
    Token.push_back('"');
    return I;
  }
  Token.append(BackslashCount, '\\');
  return I - 1;
}